

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_elements_output_init
              (uchar *script,size_t script_len,uchar *asset,size_t asset_len,uchar *value,
              size_t value_len,uchar *nonce,size_t nonce_len,uchar *surjectionproof,
              size_t surjectionproof_len,uchar *rangeproof,size_t rangeproof_len,
              wally_tx_output *output)

{
  int iVar1;
  
  iVar1 = tx_elements_output_init
                    (0xffffffffffffffff,script,script_len,asset,asset_len,value,value_len,nonce,
                     nonce_len,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len,output,
                     true);
  return iVar1;
}

Assistant:

int wally_tx_elements_output_init(
    const unsigned char *script,
    size_t script_len,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    struct wally_tx_output *output)
{
    return tx_elements_output_init(MAX_INVALID_SATOSHI, script, script_len,
                                   asset, asset_len, value, value_len,
                                   nonce, nonce_len,
                                   surjectionproof, surjectionproof_len,
                                   rangeproof, rangeproof_len, output, true);
}